

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

void __thiscall
Assimp::PLYImporter::LoadFace
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  undefined8 uVar1;
  uint uVar2;
  aiMesh *paVar3;
  undefined8 *puVar4;
  pointer pVVar5;
  aiVector3D *paVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong *puVar11;
  aiFace *paVar12;
  aiFace *paVar13;
  void *pvVar14;
  PropertyInstance *pPVar15;
  uint *puVar16;
  aiVector3D *paVar17;
  DeadlyImportError *this_00;
  ulong uVar18;
  ulong uVar19;
  pointer pPVar20;
  int iVar21;
  EDataType EVar22;
  bool bVar23;
  int iVar24;
  ValueUnion *pVVar25;
  pointer pVVar26;
  int iVar27;
  PLYImporter *pPVar28;
  EDataType eType;
  ulong uVar29;
  float fVar30;
  allocator<char> local_81;
  PLYImporter *local_80;
  aiMesh *local_78;
  pointer local_70;
  undefined8 local_68;
  ulong local_60;
  aiMesh *local_58;
  string local_50;
  
  uVar18 = (ulong)pos;
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fd,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fe,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  paVar3 = this->mGeneratedMesh;
  if (paVar3 == (aiMesh *)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Invalid .ply file: Vertices should be declared before faces",
               &local_81);
    DeadlyImportError::DeadlyImportError(this_00,&local_50);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcElement->eSemantic == EEST_TriStrip) {
    eType = EDT_Char;
    iVar24 = -1;
    iVar27 = 0;
    for (pPVar20 = (pcElement->alProperties).
                   super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pPVar20 !=
        (pcElement->alProperties).
        super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
        super__Vector_impl_data._M_finish; pPVar20 = pPVar20 + 1) {
      if (pPVar20->bIsList == true) {
        eType = pPVar20->eType;
        bVar7 = true;
        goto LAB_0044e93b;
      }
      iVar27 = iVar27 + 1;
    }
    bVar7 = false;
    iVar27 = iVar24;
LAB_0044e93b:
    local_68 = (PropertyInstance *)((ulong)local_68._4_4_ << 0x20);
    bVar23 = bVar7;
  }
  else {
    if (pcElement->eSemantic != EEST_Face) {
      return;
    }
    iVar24 = -1;
    iVar21 = 0;
    EVar22 = EDT_Char;
    eType = EDT_Char;
    iVar27 = -1;
    bVar23 = false;
    for (pPVar20 = (pcElement->alProperties).
                   super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pPVar20 !=
        (pcElement->alProperties).
        super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
        super__Vector_impl_data._M_finish; pPVar20 = pPVar20 + 1) {
      if (pPVar20->Semantic == EST_TextureCoordinates) {
        if (pPVar20->bIsList == true) {
          EVar22 = pPVar20->eType;
          bVar23 = true;
          iVar24 = iVar21;
        }
      }
      else if ((pPVar20->Semantic == EST_VertexIndex) && (pPVar20->bIsList == true)) {
        eType = pPVar20->eType;
        bVar23 = true;
        iVar27 = iVar21;
      }
      iVar21 = iVar21 + 1;
    }
    local_68 = (PropertyInstance *)CONCAT44(local_68._4_4_,EVar22);
    bVar7 = false;
  }
  if (bVar23) {
    local_78 = (aiMesh *)CONCAT44(local_78._4_4_,eType);
    local_80 = this;
    local_70 = (pointer)pcElement;
    if (paVar3->mFaces == (aiFace *)0x0) {
      local_60 = CONCAT44(local_60._4_4_,pos);
      paVar3->mNumFaces = pcElement->NumOccur;
      paVar3 = this->mGeneratedMesh;
      uVar18 = (ulong)paVar3->mNumFaces;
      puVar11 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
      paVar13 = (aiFace *)(puVar11 + 1);
      *puVar11 = uVar18;
      if (uVar18 != 0) {
        paVar12 = paVar13;
        do {
          paVar12->mNumIndices = 0;
          paVar12->mIndices = (uint *)0x0;
          paVar12 = paVar12 + 1;
        } while (paVar12 != paVar13 + uVar18);
      }
      paVar3->mFaces = paVar13;
      uVar18 = local_60 & 0xffffffff;
      eType = (EDataType)local_78;
    }
    pPVar28 = local_80;
    if (bVar7) {
      local_68 = anon_unknown.dwarf_963d53::GetProperty<Assimp::PLY::PropertyInstance>
                           (&instElement->alProperties,iVar27);
      iVar24 = -1;
      bVar7 = false;
      local_60 = uVar18 << 4;
      iVar27 = -1;
      for (pVVar25 = (local_68->avList).
                     super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pVVar25 !=
          (local_68->avList).
          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
          ._M_impl.super__Vector_impl_data._M_finish; pVVar25 = pVVar25 + 1) {
        iVar21 = PLY::PropertyInstance::ConvertTo<int>(*pVVar25,eType);
        if (iVar21 == -1) {
          bVar7 = false;
          iVar9 = -1;
          iVar8 = -1;
        }
        else {
          iVar9 = iVar27;
          iVar8 = iVar21;
          if ((iVar24 != -1) && (iVar9 = iVar21, iVar8 = iVar24, iVar27 != -1)) {
            paVar13 = pPVar28->mGeneratedMesh->mFaces;
            if (paVar13 == (aiFace *)0x0) {
              pPVar28->mGeneratedMesh->mNumFaces = *(uint *)((long)local_70 + 0x40);
              local_58 = pPVar28->mGeneratedMesh;
              uVar18 = (ulong)local_58->mNumFaces;
              puVar11 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
              paVar13 = (aiFace *)(puVar11 + 1);
              *puVar11 = uVar18;
              if (uVar18 != 0) {
                paVar12 = paVar13;
                do {
                  paVar12->mNumIndices = 0;
                  paVar12->mIndices = (uint *)0x0;
                  paVar12 = paVar12 + 1;
                } while (paVar12 != paVar13 + uVar18);
              }
              local_58->mFaces = paVar13;
              paVar13 = local_80->mGeneratedMesh->mFaces;
              pPVar28 = local_80;
            }
            uVar18 = local_60;
            *(undefined4 *)((long)&paVar13->mNumIndices + local_60) = 3;
            pvVar14 = operator_new__(0xc);
            *(void **)((long)&pPVar28->mGeneratedMesh->mFaces->mIndices + uVar18) = pvVar14;
            **(int **)((long)&pPVar28->mGeneratedMesh->mFaces->mIndices + uVar18) = iVar24;
            *(int *)(*(long *)((long)&pPVar28->mGeneratedMesh->mFaces->mIndices + uVar18) + 4) =
                 iVar27;
            *(int *)(*(long *)((long)&pPVar28->mGeneratedMesh->mFaces->mIndices + uVar18) + 8) =
                 iVar21;
            bVar7 = !bVar7;
            if (bVar7) {
              puVar4 = *(undefined8 **)((long)&pPVar28->mGeneratedMesh->mFaces->mIndices + uVar18);
              uVar1 = *puVar4;
              *puVar4 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
            }
            eType = (EDataType)local_78;
            iVar8 = iVar27;
          }
        }
        iVar24 = iVar8;
        iVar27 = iVar9;
      }
    }
    else {
      if (iVar27 != -1) {
        pPVar15 = anon_unknown.dwarf_963d53::GetProperty<Assimp::PLY::PropertyInstance>
                            (&instElement->alProperties,iVar27);
        pPVar28 = local_80;
        uVar19 = (long)(pPVar15->avList).
                       super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar15->avList).
                       super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar29 = uVar19 >> 3;
        local_80->mGeneratedMesh->mFaces[uVar18].mNumIndices = (uint)uVar29;
        puVar16 = (uint *)operator_new__(uVar19 >> 1 & 0x3fffffffc);
        pPVar28->mGeneratedMesh->mFaces[uVar18].mIndices = puVar16;
        pPVar15 = anon_unknown.dwarf_963d53::GetProperty<Assimp::PLY::PropertyInstance>
                            (&instElement->alProperties,iVar27);
        pVVar26 = (pPVar15->avList).
                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (uVar19 = 0; (uVar29 & 0xffffffff) != uVar19; uVar19 = uVar19 + 1) {
          uVar10 = PLY::PropertyInstance::ConvertTo<unsigned_int>
                             (pVVar26[uVar19],(EDataType)local_78);
          local_80->mGeneratedMesh->mFaces[uVar18].mIndices[uVar19] = uVar10;
        }
      }
      pPVar28 = local_80;
      if (iVar24 != -1) {
        pPVar15 = anon_unknown.dwarf_963d53::GetProperty<Assimp::PLY::PropertyInstance>
                            (&instElement->alProperties,iVar24);
        pVVar26 = (pPVar15->avList).
                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pVVar5 = (pPVar15->avList).
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar15 = anon_unknown.dwarf_963d53::GetProperty<Assimp::PLY::PropertyInstance>
                            (&instElement->alProperties,iVar24);
        iVar24 = (int)((ulong)((long)pVVar26 - (long)pVVar5) >> 3);
        if (iVar24 - 6U < 3) {
          pVVar26 = (pPVar15->avList).
                    super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_70 = pVVar26;
          for (uVar19 = 0; iVar24 != (int)uVar19; uVar19 = uVar19 + 1) {
            paVar3 = pPVar28->mGeneratedMesh;
            uVar10 = paVar3->mFaces[uVar18].mIndices[uVar19 >> 1 & 0x7fffffff];
            if (uVar10 < paVar3->mNumVertices) {
              if (paVar3->mTextureCoords[0] == (aiVector3D *)0x0) {
                paVar3->mNumUVComponents[0] = 2;
                local_78 = pPVar28->mGeneratedMesh;
                uVar2 = local_78->mNumVertices;
                uVar29 = (ulong)uVar2 * 0xc;
                paVar17 = (aiVector3D *)operator_new__(uVar29);
                if ((ulong)uVar2 != 0) {
                  uVar29 = uVar29 - 0xc;
                  memset(paVar17,0,(uVar29 - uVar29 % 0xc) + 0xc);
                }
                local_78->mTextureCoords[0] = paVar17;
                pVVar26 = local_70;
                pPVar28 = local_80;
              }
              fVar30 = PLY::PropertyInstance::ConvertTo<float>(pVVar26[uVar19],(EDataType)local_68);
              paVar17 = pPVar28->mGeneratedMesh->mTextureCoords[0];
              paVar6 = (aiVector3D *)&paVar17->y;
              if ((uVar19 & 1) == 0) {
                paVar6 = paVar17;
              }
              paVar6[uVar10].x = fVar30;
              pPVar28->mGeneratedMesh->mTextureCoords[0][uVar10].z = 0.0;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadFace(const PLY::Element* pcElement, const PLY::ElementInstance* instElement,
        unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Vertices should be declared before faces");
    }

    bool bOne = false;

    // index of the vertex index list
    unsigned int iProperty = 0xFFFFFFFF;
    PLY::EDataType eType = EDT_Char;
    bool bIsTriStrip = false;

    // index of the material index property
    //unsigned int iMaterialIndex = 0xFFFFFFFF;
    //PLY::EDataType eType2 = EDT_Char;

    // texture coordinates
    unsigned int iTextureCoord = 0xFFFFFFFF;
    PLY::EDataType eType3 = EDT_Char;

    // face = unique number of vertex indices
    if (PLY::EEST_Face == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            if (PLY::EST_VertexIndex == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }

                iProperty = _a;
                bOne = true;
                eType = (*a).eType;
            } else if (PLY::EST_TextureCoordinates == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }
                iTextureCoord = _a;
                bOne = true;
                eType3 = (*a).eType;
            }
        }
    }
    // triangle strip
    // TODO: triangle strip and material index support???
    else if (PLY::EEST_TriStrip == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            // must be a dynamic list!
            if (!(*a).bIsList) {
                continue;
            }
            iProperty = _a;
            bOne = true;
            bIsTriStrip = true;
            eType = (*a).eType;
            break;
        }
    }

    // check whether we have at least one per-face information set
    if (bOne) {
        if (mGeneratedMesh->mFaces == nullptr) {
            mGeneratedMesh->mNumFaces = pcElement->NumOccur;
            mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
        }

        if (!bIsTriStrip) {
            // parse the list of vertex indices
            if (0xFFFFFFFF != iProperty) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iProperty).avList.size();
                mGeneratedMesh->mFaces[pos].mNumIndices = iNum;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[iNum];

                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iProperty).avList.begin();

                for (unsigned int a = 0; a < iNum; ++a, ++p) {
                    mGeneratedMesh->mFaces[pos].mIndices[a] = PLY::PropertyInstance::ConvertTo<unsigned int>(*p, eType);
                }
            }

        // parse the material index
        // cannot be handled without processing the whole file first
        /*if (0xFFFFFFFF != iMaterialIndex)
        {
            mGeneratedMesh->mFaces[pos]. = PLY::PropertyInstance::ConvertTo<unsigned int>(
            GetProperty(instElement->alProperties, iMaterialIndex).avList.front(), eType2);
        }*/

            if (0xFFFFFFFF != iTextureCoord) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iTextureCoord).avList.size();

                //should be 6 coords
                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iTextureCoord).avList.begin();

                if ((iNum / 3) == 2) // X Y coord
                {
                    for (unsigned int a = 0; a < iNum; ++a, ++p) {
                        unsigned int vindex = mGeneratedMesh->mFaces[pos].mIndices[a / 2];
                        if (vindex < mGeneratedMesh->mNumVertices) {
                            if (mGeneratedMesh->mTextureCoords[0] == nullptr ) {
                                mGeneratedMesh->mNumUVComponents[0] = 2;
                                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
                            }

                            if (a % 2 == 0) {
                                mGeneratedMesh->mTextureCoords[0][vindex].x = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            } else {
                                mGeneratedMesh->mTextureCoords[0][vindex].y = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            }

                            mGeneratedMesh->mTextureCoords[0][vindex].z = 0;
                        }
                    }
                }
            }
        } else { // triangle strips
            // normally we have only one triangle strip instance where
            // a value of -1 indicates a restart of the strip
            bool flip = false;
            const std::vector<PLY::PropertyInstance::ValueUnion>& quak = GetProperty(instElement->alProperties, iProperty).avList;
            //pvOut->reserve(pvOut->size() + quak.size() + (quak.size()>>2u)); //Limits memory consumption

            int aiTable[2] = { -1, -1 };
            for (std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator a = quak.begin(); a != quak.end(); ++a)  {
                const int p = PLY::PropertyInstance::ConvertTo<int>(*a, eType);

                if (-1 == p) {
                    // restart the strip ...
                    aiTable[0] = aiTable[1] = -1;
                    flip = false;
                    continue;
                }
                if (-1 == aiTable[0]) {
                    aiTable[0] = p;
                    continue;
                }
                if (-1 == aiTable[1]) {
                    aiTable[1] = p;
                    continue;
                }

                if (mGeneratedMesh->mFaces == nullptr) {
                    mGeneratedMesh->mNumFaces = pcElement->NumOccur;
                    mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
                }

                mGeneratedMesh->mFaces[pos].mNumIndices = 3;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[3];
                mGeneratedMesh->mFaces[pos].mIndices[0] = aiTable[0];
                mGeneratedMesh->mFaces[pos].mIndices[1] = aiTable[1];
                mGeneratedMesh->mFaces[pos].mIndices[2] = p;

                // every second pass swap the indices.
                flip = !flip;
                if ( flip ) {
                    std::swap(mGeneratedMesh->mFaces[pos].mIndices[0], mGeneratedMesh->mFaces[pos].mIndices[1]);
                }

                aiTable[0] = aiTable[1];
                aiTable[1] = p;
            }
        }
    }
}